

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

int __thiscall
Centaurus::CATNMachine<unsigned_char>::import_whitespace
          (CATNMachine<unsigned_char> *this,CharClass<unsigned_char> *cc,int origin,int tag)

{
  reference this_00;
  CharClass<unsigned_char> local_40;
  int local_20;
  int local_1c;
  int tag_local;
  int origin_local;
  CharClass<unsigned_char> *cc_local;
  CATNMachine<unsigned_char> *this_local;
  
  local_20 = tag;
  local_1c = origin;
  _tag_local = cc;
  cc_local = (CharClass<unsigned_char> *)this;
  CharClass<unsigned_char>::CharClass(&local_40);
  local_1c = add_node(this,&local_40,local_1c,local_20);
  CharClass<unsigned_char>::~CharClass(&local_40);
  this_00 = std::
            vector<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
            ::operator[](&this->m_nodes,(long)local_1c);
  CATNNode<unsigned_char>::add_transition(this_00,_tag_local,local_1c,0);
  return local_1c;
}

Assistant:

CharClass(const std::initializer_list<wchar_t>& ch_list)
    {
        for (wchar_t ch : ch_list)
        {
            m_ranges.push_back(Range<TCHAR>(ch, ch + 1));
        }
    }